

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::load_regs(Snes_Spc *this,uint8_t *in)

{
  uint8_t *in_local;
  Snes_Spc *this_local;
  
  *(undefined8 *)(this->m).smp_regs[0] = *(undefined8 *)in;
  *(undefined8 *)((this->m).smp_regs[0] + 8) = *(undefined8 *)(in + 8);
  *(undefined8 *)(this->m).smp_regs[1] = *(undefined8 *)(this->m).smp_regs[0];
  *(undefined8 *)((this->m).smp_regs[1] + 8) = *(undefined8 *)((this->m).smp_regs[0] + 8);
  (this->m).smp_regs[1][0] = '\0';
  (this->m).smp_regs[1][1] = '\0';
  (this->m).smp_regs[1][10] = '\0';
  (this->m).smp_regs[1][0xb] = '\0';
  (this->m).smp_regs[1][0xc] = '\0';
  return;
}

Assistant:

void Snes_Spc::load_regs( uint8_t const in [reg_count] )
{
	memcpy( REGS, in, reg_count );
	memcpy( REGS_IN, REGS, reg_count );
	
	// These always read back as 0
	REGS_IN [r_test    ] = 0;
	REGS_IN [r_control ] = 0;
	REGS_IN [r_t0target] = 0;
	REGS_IN [r_t1target] = 0;
	REGS_IN [r_t2target] = 0;
}